

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_form.c
# Opt level: O0

int dwarf_formexprloc(Dwarf_Attribute attr,Dwarf_Unsigned *return_exprlen,Dwarf_Ptr *block_ptr,
                     Dwarf_Error *error)

{
  ushort uVar1;
  Dwarf_CU_Context_conflict pDVar2;
  Dwarf_Debug pDVar3;
  int iVar4;
  char *pcVar5;
  char *pcStack_108;
  uint mform;
  char *name;
  dwarfstring m_2;
  dwarfstring m_1;
  dwarfstring m;
  Dwarf_Small *pDStack_98;
  int lu_res;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Small *addr;
  Dwarf_Unsigned exprlen;
  Dwarf_Byte_Ptr info_ptr;
  Dwarf_Byte_Ptr section_end;
  Dwarf_Unsigned section_len;
  Dwarf_Byte_Ptr section_start;
  Dwarf_Unsigned leb_len;
  Dwarf_Die die;
  Dwarf_CU_Context_conflict pDStack_40;
  int res;
  Dwarf_CU_Context_conflict cu_context;
  Dwarf_Debug dbg;
  Dwarf_Error *error_local;
  Dwarf_Ptr *block_ptr_local;
  Dwarf_Unsigned *return_exprlen_local;
  Dwarf_Attribute attr_local;
  
  cu_context = (Dwarf_CU_Context_conflict)0x0;
  pDStack_40 = (Dwarf_CU_Context_conflict)0x0;
  dbg = (Dwarf_Debug)error;
  error_local = (Dwarf_Error *)block_ptr;
  block_ptr_local = (Dwarf_Ptr *)return_exprlen;
  return_exprlen_local = (Dwarf_Unsigned *)attr;
  die._4_4_ = get_attr_dbg((Dwarf_Debug *)&cu_context,&stack0xffffffffffffffc0,attr,error);
  attr_local._4_4_ = die._4_4_;
  if (die._4_4_ == 0) {
    if (*(short *)((long)return_exprlen_local + 2) == 0x18) {
      leb_len = 0;
      section_start = (Dwarf_Byte_Ptr)0x0;
      section_len = 0;
      section_end = (Dwarf_Byte_Ptr)0x0;
      info_ptr = (Dwarf_Byte_Ptr)0x0;
      addr = (Dwarf_Small *)0x0;
      lu_leblen = return_exprlen_local[2];
      exprlen = lu_leblen;
      section_len = (Dwarf_Unsigned)
                    _dwarf_calculate_info_section_start_ptr
                              (pDStack_40,(Dwarf_Unsigned *)&section_end);
      info_ptr = (Dwarf_Byte_Ptr)(section_len + (long)section_end);
      lu_local = 0;
      pDStack_98 = (Dwarf_Small *)0x0;
      iVar4 = dwarf_decode_leb128((char *)exprlen,&lu_local,
                                  (Dwarf_Unsigned *)&stack0xffffffffffffff68,(char *)info_ptr);
      if (iVar4 == 1) {
        _dwarf_error_string((Dwarf_Debug)cu_context,(Dwarf_Error *)dbg,0x149,
                            "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
        attr_local._4_4_ = 1;
      }
      else {
        addr = pDStack_98;
        exprlen = lu_local + exprlen;
        section_start = (Dwarf_Byte_Ptr)lu_local;
        if (section_end < pDStack_98) {
          dwarfstring_constructor((dwarfstring_s *)&m_1.s_malloc);
          dwarfstring_append_printf_u
                    ((dwarfstring *)&m_1.s_malloc,
                     "DW_DLE_ATTR_OUTSIDE_SECTION: The expression length is %u,",(dwarfstring_u)addr
                    );
          dwarfstring_append_printf_u
                    ((dwarfstring *)&m_1.s_malloc,
                     " but the section length is just %u. Corrupt Dwarf.",(dwarfstring_u)section_end
                    );
          pDVar3 = dbg;
          pDVar2 = cu_context;
          pcVar5 = dwarfstring_string((dwarfstring_s *)&m_1.s_malloc);
          _dwarf_error_string((Dwarf_Debug)pDVar2,(Dwarf_Error *)pDVar3,0x119,pcVar5);
          dwarfstring_destructor((dwarfstring_s *)&m_1.s_malloc);
          attr_local._4_4_ = 1;
        }
        else {
          leb_len = return_exprlen_local[5];
          iVar4 = _dwarf_reference_outside_section
                            ((Dwarf_Die)leb_len,(Dwarf_Small *)lu_leblen,
                             pDStack_98 + lu_local + lu_leblen);
          if (iVar4 == 0) {
            *block_ptr_local = addr;
            *error_local = (Dwarf_Error)(section_start + lu_leblen);
            attr_local._4_4_ = 0;
          }
          else {
            dwarfstring_constructor((dwarfstring_s *)&m_2.s_malloc);
            dwarfstring_append_printf_u
                      ((dwarfstring *)&m_2.s_malloc,
                       "DW_DLE_ATTR_OUTSIDE_SECTION: The expression length %u,",(dwarfstring_u)addr)
            ;
            dwarfstring_append_printf_u
                      ((dwarfstring *)&m_2.s_malloc," plus the leb value length of %u ",
                       (dwarfstring_u)section_start);
            dwarfstring_append((dwarfstring_s *)&m_2.s_malloc,
                               " runs past the end of the section. Corrupt Dwarf.");
            pDVar3 = dbg;
            pDVar2 = cu_context;
            pcVar5 = dwarfstring_string((dwarfstring_s *)&m_2.s_malloc);
            _dwarf_error_string((Dwarf_Debug)pDVar2,(Dwarf_Error *)pDVar3,0x119,pcVar5);
            dwarfstring_destructor((dwarfstring_s *)&m_2.s_malloc);
            attr_local._4_4_ = 1;
          }
        }
      }
    }
    else {
      pcStack_108 = "<name not known>";
      uVar1 = *(ushort *)((long)return_exprlen_local + 2);
      dwarfstring_constructor((dwarfstring_s *)&name);
      dwarf_get_FORM_name((uint)uVar1,&stack0xfffffffffffffef8);
      dwarfstring_append_printf_u
                ((dwarfstring *)&name,"DW_DLE_ATTR_EXPRLOC_FORM_BAD: The form is 0x%x ",
                 (ulong)(uint)uVar1);
      dwarfstring_append_printf_s
                ((dwarfstring *)&name,"(%s) but should be DW_FORM_exprloc. Corrupt Dwarf.",
                 pcStack_108);
      pDVar3 = dbg;
      pDVar2 = cu_context;
      pcVar5 = dwarfstring_string((dwarfstring_s *)&name);
      _dwarf_error_string((Dwarf_Debug)pDVar2,(Dwarf_Error *)pDVar3,0xe0,pcVar5);
      dwarfstring_destructor((dwarfstring_s *)&name);
      attr_local._4_4_ = 1;
    }
  }
  return attr_local._4_4_;
}

Assistant:

int
dwarf_formexprloc(Dwarf_Attribute attr,
    Dwarf_Unsigned * return_exprlen,
    Dwarf_Ptr  * block_ptr,
    Dwarf_Error * error)
{
    Dwarf_Debug dbg = 0;
    Dwarf_CU_Context cu_context = 0;

    int res  = get_attr_dbg(&dbg,&cu_context,attr,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    if (attr->ar_attribute_form == DW_FORM_exprloc ) {
        Dwarf_Die die = 0;
        Dwarf_Unsigned leb_len = 0;
        Dwarf_Byte_Ptr section_start = 0;
        Dwarf_Unsigned section_len = 0;
        Dwarf_Byte_Ptr section_end = 0;
        Dwarf_Byte_Ptr info_ptr = 0;
        Dwarf_Unsigned exprlen = 0;
        Dwarf_Small * addr = attr->ar_debug_ptr;

        info_ptr = addr;
        section_start =
            _dwarf_calculate_info_section_start_ptr(cu_context,
            &section_len);
        section_end = section_start + section_len;

        DECODE_LEB128_UWORD_LEN_CK(info_ptr, exprlen, leb_len,
            dbg,error,section_end);
        if (exprlen > section_len) {
            /* Corrupted dwarf!  */
            dwarfstring m;

            dwarfstring_constructor(&m);
            dwarfstring_append_printf_u(&m,
                "DW_DLE_ATTR_OUTSIDE_SECTION: "
                "The expression length is %u,",exprlen);
            dwarfstring_append_printf_u(&m,
                " but the section length is just %u. "
                "Corrupt Dwarf.",section_len);
            _dwarf_error_string(dbg, error,
                DW_DLE_ATTR_OUTSIDE_SECTION,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        die = attr->ar_die;
        /*  Is the block entirely in the section, or is
            there bug somewhere?
            Here the final addr may be 1 past end of section. */
        if (_dwarf_reference_outside_section(die,
            (Dwarf_Small *)addr,
            ((Dwarf_Small *)addr)+exprlen +leb_len)) {
            dwarfstring m;

            dwarfstring_constructor(&m);
            dwarfstring_append_printf_u(&m,
                "DW_DLE_ATTR_OUTSIDE_SECTION: "
                "The expression length %u,",exprlen);
            dwarfstring_append_printf_u(&m,
                " plus the leb value length of "
                "%u ",leb_len);
            dwarfstring_append(&m,
                " runs past the end of the section. "
                "Corrupt Dwarf.");
            _dwarf_error_string(dbg, error,
                DW_DLE_ATTR_OUTSIDE_SECTION,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        *return_exprlen = exprlen;
        *block_ptr = addr + leb_len;
        return DW_DLV_OK;

    }
    {
        dwarfstring m;
        const char *name = "<name not known>";
        unsigned  mform = attr->ar_attribute_form;

        dwarfstring_constructor(&m);

        dwarf_get_FORM_name (mform,&name);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_ATTR_EXPRLOC_FORM_BAD: "
            "The form is 0x%x ", mform);
        dwarfstring_append_printf_s(&m,
            "(%s) but should be DW_FORM_exprloc. "
            "Corrupt Dwarf.",(char *)name);
        _dwarf_error_string(dbg, error, DW_DLE_ATTR_EXPRLOC_FORM_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
    }
    return DW_DLV_ERROR;
}